

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jcarith.c
# Opt level: O0

boolean encode_mcu_DC_first(j_compress_ptr cinfo,JBLOCKROW *MCU_data)

{
  byte bVar1;
  long lVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  long in_RSI;
  long *in_RDI;
  jpeg_component_info *compptr;
  JBLOCKROW block;
  int Al;
  int ci;
  int blkn;
  int nbits;
  int temp3;
  int temp2;
  int temp;
  phuff_entropy_ptr entropy;
  undefined8 in_stack_ffffffffffffffb8;
  long lVar6;
  phuff_entropy_ptr in_stack_ffffffffffffffc0;
  phuff_entropy_ptr entropy_00;
  int in_stack_ffffffffffffffc8;
  uint code;
  int iVar7;
  int iVar8;
  
  lVar2 = in_RDI[0x3e];
  code = *(uint *)(in_RDI + 0x35);
  *(undefined8 *)(lVar2 + 0x30) = *(undefined8 *)in_RDI[5];
  *(undefined8 *)(lVar2 + 0x38) = *(undefined8 *)(in_RDI[5] + 8);
  if (((int)in_RDI[0x23] != 0) && (*(int *)(lVar2 + 0x80) == 0)) {
    emit_restart(in_stack_ffffffffffffffc0,(int)((ulong)in_stack_ffffffffffffffb8 >> 0x20));
  }
  for (iVar8 = 0; iVar8 < (int)in_RDI[0x2e]; iVar8 = iVar8 + 1) {
    entropy_00 = *(phuff_entropy_ptr *)(in_RSI + (long)iVar8 * 8);
    iVar7 = *(int *)((long)in_RDI + (long)iVar8 * 4 + 0x174);
    lVar6 = in_RDI[(long)iVar7 + 0x29];
    iVar3 = (int)*(short *)&(entropy_00->pub).start_pass >> ((byte)code & 0x1f);
    uVar4 = iVar3 - *(int *)(lVar2 + 0x58 + (long)iVar7 * 4);
    *(int *)(lVar2 + 0x58 + (long)iVar7 * 4) = iVar3;
    uVar5 = (int)uVar4 >> 0x1f;
    bVar1 = ""[(int)((uVar5 ^ uVar4) - uVar5)];
    if (0xb < bVar1) {
      *(undefined4 *)(*in_RDI + 0x28) = 6;
      (**(code **)*in_RDI)(in_RDI);
    }
    emit_symbol(entropy_00,(int)((ulong)lVar6 >> 0x20),(int)lVar6);
    if (bVar1 != 0) {
      emit_bits((phuff_entropy_ptr)CONCAT44(iVar8,iVar7),code,in_stack_ffffffffffffffc8);
    }
  }
  *(undefined8 *)in_RDI[5] = *(undefined8 *)(lVar2 + 0x30);
  *(undefined8 *)(in_RDI[5] + 8) = *(undefined8 *)(lVar2 + 0x38);
  if ((int)in_RDI[0x23] != 0) {
    if (*(int *)(lVar2 + 0x80) == 0) {
      *(int *)(lVar2 + 0x80) = (int)in_RDI[0x23];
      *(int *)(lVar2 + 0x84) = *(int *)(lVar2 + 0x84) + 1;
      *(uint *)(lVar2 + 0x84) = *(uint *)(lVar2 + 0x84) & 7;
    }
    *(int *)(lVar2 + 0x80) = *(int *)(lVar2 + 0x80) + -1;
  }
  return 1;
}

Assistant:

METHODDEF(boolean)
encode_mcu_DC_first(j_compress_ptr cinfo, JBLOCKROW *MCU_data)
{
  arith_entropy_ptr entropy = (arith_entropy_ptr)cinfo->entropy;
  JBLOCKROW block;
  unsigned char *st;
  int blkn, ci, tbl;
  int v, v2, m;
  ISHIFT_TEMPS

  /* Emit restart marker if needed */
  if (cinfo->restart_interval) {
    if (entropy->restarts_to_go == 0) {
      emit_restart(cinfo, entropy->next_restart_num);
      entropy->restarts_to_go = cinfo->restart_interval;
      entropy->next_restart_num++;
      entropy->next_restart_num &= 7;
    }
    entropy->restarts_to_go--;
  }

  /* Encode the MCU data blocks */
  for (blkn = 0; blkn < cinfo->blocks_in_MCU; blkn++) {
    block = MCU_data[blkn];
    ci = cinfo->MCU_membership[blkn];
    tbl = cinfo->cur_comp_info[ci]->dc_tbl_no;

    /* Compute the DC value after the required point transform by Al.
     * This is simply an arithmetic right shift.
     */
    m = IRIGHT_SHIFT((int)((*block)[0]), cinfo->Al);

    /* Sections F.1.4.1 & F.1.4.4.1: Encoding of DC coefficients */

    /* Table F.4: Point to statistics bin S0 for DC coefficient coding */
    st = entropy->dc_stats[tbl] + entropy->dc_context[ci];

    /* Figure F.4: Encode_DC_DIFF */
    if ((v = m - entropy->last_dc_val[ci]) == 0) {
      arith_encode(cinfo, st, 0);
      entropy->dc_context[ci] = 0;      /* zero diff category */
    } else {
      entropy->last_dc_val[ci] = m;
      arith_encode(cinfo, st, 1);
      /* Figure F.6: Encoding nonzero value v */
      /* Figure F.7: Encoding the sign of v */
      if (v > 0) {
        arith_encode(cinfo, st + 1, 0); /* Table F.4: SS = S0 + 1 */
        st += 2;                        /* Table F.4: SP = S0 + 2 */
        entropy->dc_context[ci] = 4;    /* small positive diff category */
      } else {
        v = -v;
        arith_encode(cinfo, st + 1, 1); /* Table F.4: SS = S0 + 1 */
        st += 3;                        /* Table F.4: SN = S0 + 3 */
        entropy->dc_context[ci] = 8;    /* small negative diff category */
      }
      /* Figure F.8: Encoding the magnitude category of v */
      m = 0;
      if (v -= 1) {
        arith_encode(cinfo, st, 1);
        m = 1;
        v2 = v;
        st = entropy->dc_stats[tbl] + 20; /* Table F.4: X1 = 20 */
        while (v2 >>= 1) {
          arith_encode(cinfo, st, 1);
          m <<= 1;
          st += 1;
        }
      }
      arith_encode(cinfo, st, 0);
      /* Section F.1.4.4.1.2: Establish dc_context conditioning category */
      if (m < (int)((1L << cinfo->arith_dc_L[tbl]) >> 1))
        entropy->dc_context[ci] = 0;    /* zero diff category */
      else if (m > (int)((1L << cinfo->arith_dc_U[tbl]) >> 1))
        entropy->dc_context[ci] += 8;   /* large diff category */
      /* Figure F.9: Encoding the magnitude bit pattern of v */
      st += 14;
      while (m >>= 1)
        arith_encode(cinfo, st, (m & v) ? 1 : 0);
    }
  }

  return TRUE;
}